

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::set_name(Track *this,char *name)

{
  size_t sVar1;
  char *pcVar2;
  size_t length;
  char *name_local;
  Track *this_local;
  
  if (name != (char *)0x0) {
    if (this->name_ != (char *)0x0) {
      operator_delete__(this->name_);
    }
    sVar1 = strlen(name);
    pcVar2 = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
    this->name_ = pcVar2;
    if (this->name_ != (char *)0x0) {
      strcpy(this->name_,name);
    }
  }
  return;
}

Assistant:

void Track::set_name(const char* name) {
  if (name) {
    delete[] name_;

    const size_t length = strlen(name) + 1;
    name_ = new (std::nothrow) char[length];  // NOLINT
    if (name_) {
#ifdef _MSC_VER
      strcpy_s(name_, length, name);
#else
      strcpy(name_, name);
#endif
    }
  }
}